

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

char * http_lookup_type(char *path)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t l2;
  int i;
  size_t l1;
  char *path_local;
  
  sVar2 = strlen(path);
  l2._4_4_ = 0;
  while( true ) {
    if (content_map[l2._4_4_].ext == (char *)0x0) {
      return (char *)0x0;
    }
    sVar3 = strlen(content_map[l2._4_4_].ext);
    if ((sVar3 <= sVar2) &&
       (iVar1 = nni_strcasecmp(path + (sVar2 - sVar3),content_map[l2._4_4_].ext), iVar1 == 0))
    break;
    l2._4_4_ = l2._4_4_ + 1;
  }
  return content_map[l2._4_4_].typ;
}

Assistant:

const char *
http_lookup_type(const char *path)
{
	size_t l1 = strlen(path);
	for (int i = 0; content_map[i].ext != NULL; i++) {
		size_t l2 = strlen(content_map[i].ext);
		if (l2 > l1) {
			continue;
		}
		if (nni_strcasecmp(&path[l1 - l2], content_map[i].ext) == 0) {
			return (content_map[i].typ);
		}
	}
	return (NULL);
}